

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O1

Real __thiscall
amrex::LineDistFcnElement2d::cpside(LineDistFcnElement2d *this,RealVect pt,RealVect *cpmin)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Real RVar13;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  
  local_78 = 0.0;
  local_80 = 0.0;
  uVar4 = (uint)((ulong)((long)(this->control_points_x).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->control_points_x).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  if (1 < (int)uVar4) {
    dVar11 = 1e+29;
    uVar5 = 1;
    local_88 = 0.0;
    local_90 = 0.0;
    local_78 = 0.0;
    local_80 = 0.0;
    do {
      pdVar2 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = pdVar2[uVar5 - 1];
      dVar7 = pdVar2[uVar5];
      dVar1 = pdVar3[uVar5];
      dVar9 = dVar7 - dVar6;
      dVar12 = pdVar3[uVar5 - 1];
      RVar13 = 0.0;
      dVar10 = dVar1 - dVar12;
      dVar8 = ((pt.vect[0] - dVar6) * dVar9 + dVar10 * (pt.vect[1] - dVar12)) /
              (dVar9 * dVar9 + dVar10 * dVar10);
      if (0.0 <= dVar8) {
        if (dVar8 <= 1.0) {
          dVar6 = dVar6 + dVar9 * dVar8;
          dVar12 = dVar12 + dVar10 * dVar8;
          RVar13 = dVar8 * 0.0 + 0.0;
        }
        else {
          RVar13 = 0.0;
          dVar6 = dVar7;
          dVar12 = dVar1;
        }
      }
      dVar7 = (pt.vect[0] - dVar6) * (pt.vect[0] - dVar6) +
              (pt.vect[1] - dVar12) * (pt.vect[1] - dVar12);
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      if (dVar7 < dVar11) {
        cpmin->vect[0] = dVar6;
        cpmin->vect[1] = dVar12;
        cpmin->vect[2] = RVar13;
        pdVar2 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (this->control_points_y).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_88 = pdVar2[uVar5 - 1];
        local_78 = pdVar2[uVar5];
        local_90 = pdVar3[uVar5 - 1];
        local_80 = pdVar3[uVar5];
        dVar11 = dVar7;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
    local_78 = local_78 - local_88;
    local_80 = local_80 - local_90;
  }
  dVar11 = (pt.vect[0] - cpmin->vect[0]) * local_80 - (pt.vect[1] - cpmin->vect[1]) * local_78;
  uVar5 = -(ulong)(dVar11 < 0.0);
  return (Real)(uVar5 & 0x3ff0000000000000 | ~uVar5 & -(ulong)(0.0 < dVar11) & 0xbff0000000000000);
}

Assistant:

amrex::Real LineDistFcnElement2d::cpside(amrex::RealVect pt,
                                         amrex::RealVect & cpmin) const {

  amrex::Real mindist, dist;
  mindist = 1.0e29;
  amrex::RealVect cp;
  amrex::RealVect l0, l1;

  for (int i=1, N=control_points_x.size(); i<N; ++i) {
    single_seg_cpdist(pt,
                      control_points_x[i-1], control_points_x[i],
                      control_points_y[i-1], control_points_y[i],
                      cp, dist);
    if (dist < mindist) {
      mindist = dist;
      cpmin = cp;
      l0 = amrex::RealVect(AMREX_D_DECL(control_points_x[i-1], control_points_y[i-1],0.0));
      l1 = amrex::RealVect(AMREX_D_DECL(control_points_x[i], control_points_y[i],0.0));
    }
  }

  //amrex::RealVect B = l1 - cpmin;
  amrex::RealVect B = l1 - l0;
  amrex::RealVect A = pt - cpmin;
  amrex::Real AcrossB = A[0]*B[1] - A[1]*B[0];

  if (AcrossB < 0.0) {
    return 1.0;
  } else if (AcrossB > 0.0) {
    return -1.0;
  } else {
    return 0.0;
    /*
    // AcrossB is zero, try extending line segment
    if (B[0]*B[0] + B[1]*B[1] != 0.0) {
      amrex::RealVect cext = amrex::RealVect(l1 - l0)*1.05 + l0;
      B = cext - cpmin;
      AcrossB = A[0]*B[1] - A[1]*B[0];
      if (AcrossB < 0.0) {
        return 1.0;
      } else if (AcrossB > 0.0) {
        return -1.0;
      }
    } else {
        // Point must be on the line, put it inside
        return 0.0;
    }
    */
  }
}